

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

LLVMValueRef CompileLlvmIfElse(LlvmCompilationContext *ctx,ExprIfElse *node)

{
  ExpressionContext *pEVar1;
  long lVar2;
  TypeBase *type;
  
  CompileLlvm(ctx,node->condition);
  type = node->condition->type;
  pEVar1 = ctx->ctx;
  lVar2 = 0x89d8;
  if (((pEVar1->typeBool != type) && (pEVar1->typeChar != type)) && (pEVar1->typeShort != type)) {
    if (pEVar1->typeFloat != type) goto LAB_0026d611;
    lVar2 = 0x89f0;
  }
  type = *(TypeBase **)((long)(pEVar1->uniqueDependencies).little + lVar2 + -0x30);
LAB_0026d611:
  CompileLlvmType(ctx,type);
  CompileLlvm(ctx,node->trueBlock);
  if (node->falseBlock != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->falseBlock);
  }
  if ((node->super_ExprBase).type == ctx->ctx->typeVoid) {
    return (LLVMValueRef)0x0;
  }
  __assert_fail("node->type == ctx.ctx.typeVoid",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x27b,"LLVMValueRef CheckType(LlvmCompilationContext &, ExprBase *, LLVMValueRef)")
  ;
}

Assistant:

LLVMValueRef CompileLlvmIfElse(LlvmCompilationContext &ctx, ExprIfElse *node)
{
	LLVMValueRef condition = CompileLlvm(ctx, node->condition);

	condition = LLVMBuildICmp(ctx.builder, LLVMIntNE, condition, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->condition->type)), 0, true), "");

	LLVMBasicBlockRef trueBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "if_true");
	LLVMBasicBlockRef falseBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "if_false");
	LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "if_exit");

	if(node->falseBlock)
		LLVMBuildCondBr(ctx.builder, condition, trueBlock, falseBlock);
	else
		LLVMBuildCondBr(ctx.builder, condition, trueBlock, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, trueBlock);

	CompileLlvm(ctx, node->trueBlock);

	LLVMBuildBr(ctx.builder, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, falseBlock);

	if(node->falseBlock)
		CompileLlvm(ctx, node->falseBlock);

	LLVMBuildBr(ctx.builder, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

	return CheckType(ctx, node, NULL);
}